

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

void roaring_bitmap_printf_describe(roaring_bitmap_t *r)

{
  byte bVar1;
  ushort uVar2;
  uint uVar3;
  byte bVar4;
  ulong uVar5;
  long lVar6;
  run_container_t *run;
  char *pcVar7;
  long lVar8;
  
  putchar(0x7b);
  if (0 < (r->high_low_container).size) {
    lVar8 = 0;
    do {
      bVar1 = (r->high_low_container).typecodes[lVar8];
      if (3 < bVar1 - 1) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                      ,0x10e3,"const char *get_full_container_name(const container_t *, uint8_t)");
      }
      uVar2 = (r->high_low_container).keys[lVar8];
      run = (run_container_t *)(r->high_low_container).containers[lVar8];
      pcVar7 = "bitset";
      switch((uint)bVar1) {
      case 2:
        pcVar7 = "array";
        break;
      case 3:
        pcVar7 = "run";
        break;
      case 4:
        bVar4 = *(char *)&run->runs - 1;
        if (2 < bVar4) {
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                        ,0x10dd,"const char *get_full_container_name(const container_t *, uint8_t)")
          ;
        }
        pcVar7 = &DAT_00126100 + *(int *)(&DAT_00126100 + (ulong)bVar4 * 4);
      }
      if (bVar1 == 4) {
        bVar1 = *(byte *)&run->runs;
        if (bVar1 == 4) {
          __assert_fail("*type != SHARED_CONTAINER_TYPE",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                        ,0x1062,
                        "const container_t *container_unwrap_shared(const container_t *, uint8_t *)"
                       );
        }
        run = *(run_container_t **)run;
      }
      if (bVar1 == 3) {
        lVar6 = cpuid_Extended_Feature_Enumeration_info(7);
        if ((*(uint *)(lVar6 + 4) & 0x20) == 0) {
          uVar3 = run->n_runs;
          if (0 < (long)(int)uVar3) {
            lVar6 = 0;
            uVar5 = (ulong)uVar3;
            do {
              uVar5 = (ulong)((int)uVar5 + (uint)run->runs[lVar6].length);
              lVar6 = lVar6 + 1;
            } while ((int)uVar3 != lVar6);
            goto LAB_00113452;
          }
        }
        else {
          uVar3 = _avx2_run_container_cardinality(run);
        }
        uVar5 = (ulong)uVar3;
      }
      else {
        if ((bVar1 != 2) && (bVar1 != 1)) {
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                        ,0x10fa,"int container_get_cardinality(const container_t *, uint8_t)");
        }
        uVar5 = (ulong)(uint)run->n_runs;
      }
LAB_00113452:
      printf("%d: %s (%d)",(ulong)uVar2,pcVar7,uVar5);
      if ((r->high_low_container).typecodes[lVar8] == '\x04') {
        printf("(shared count = %u )",
               (ulong)*(uint *)((long)(r->high_low_container).containers[lVar8] + 0xc));
      }
      lVar8 = lVar8 + 1;
      if (lVar8 < (r->high_low_container).size) {
        printf(", ");
      }
    } while (lVar8 < (r->high_low_container).size);
  }
  putchar(0x7d);
  return;
}

Assistant:

void roaring_bitmap_printf_describe(const roaring_bitmap_t *r) {
    const roaring_array_t *ra = &r->high_low_container;

    printf("{");
    for (int i = 0; i < ra->size; ++i) {
        printf("%d: %s (%d)", ra->keys[i],
               get_full_container_name(ra->containers[i], ra->typecodes[i]),
               container_get_cardinality(ra->containers[i], ra->typecodes[i]));

        if (ra->typecodes[i] == SHARED_CONTAINER_TYPE) {
            printf(
                "(shared count = %" PRIu32 " )",
                    CAST_shared(ra->containers[i])->counter);
        }

        if (i + 1 < ra->size) {
            printf(", ");
        }
    }
    printf("}");
}